

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O1

string_t duckdb::SubstringEmptyString(Vector *result)

{
  ulong uVar1;
  idx_t in_RDX;
  char *dataptr;
  string_t result_string;
  undefined1 local_10 [16];
  
  local_10 = (undefined1  [16])
             StringVector::EmptyString((StringVector *)result,(Vector *)0x0,in_RDX);
  uVar1 = (ulong)(uint)local_10._0_4_;
  if (uVar1 < 0xd) {
    switchD_01306cb1::default(local_10 + uVar1 + 4,0,0xc - uVar1);
  }
  else {
    local_10._4_4_ = *(undefined4 *)local_10._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10;
}

Assistant:

string_t SubstringEmptyString(Vector &result) {
	auto result_string = StringVector::EmptyString(result, 0);
	result_string.Finalize();
	return result_string;
}